

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *this;
  bitset<16UL> local_20;
  double local_18;
  double error;
  short exit;
  
  error._4_4_ = 0;
  error._2_2_ = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Starting");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_18 = testKalmanFilter();
  if (0.1 <= local_18) {
    error._2_2_ = error._2_2_ | 1;
    poVar1 = std::operator<<((ostream *)&std::cout,"Test Kalman filter FAILED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test Kalman filter SUCCEEDED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_18 = testKalmanFilterZeroInput();
  if (0.1 <= local_18) {
    error._2_2_ = error._2_2_ | 2;
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test Kalman filter (zero input) FAILED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test Kalman filter (zero input) SUCCEEDED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_18 = testExtendedKalmanFilter();
  if (0.1 <= local_18) {
    error._2_2_ = error._2_2_ | 4;
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test extended Kalman filter FAILED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test extended Kalman filter SUCCEEDED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_18 = testExtendedKalmanFilterLTV();
  if (0.1 <= local_18) {
    error._2_2_ = error._2_2_ | 8;
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test extended Kalman filter (LTV) FAILED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test extended Kalman filter (LTV) SUCCEEDED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_18 = testExtendedKalmanFilterZeroInput();
  if (0.1 <= local_18) {
    error._2_2_ = error._2_2_ | 0x10;
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test extended Kalman filter (zero input) FAILED: estimationError = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Test extended Kalman filter (zero input) SUCCEEDED: estimationError = "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Test exit code ");
  std::bitset<16UL>::bitset(&local_20,(long)(short)error._2_2_);
  this = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,&local_20);
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  return (int)(short)error._2_2_;
}

Assistant:

int main()
{
  short exit = 0;
  double error;
  std::cout << "Starting" << std::endl;

  if((error = testKalmanFilter()) < 0.1)
  {
    std::cout << "Test Kalman filter SUCCEEDED: estimationError = " << error << std::endl;
  }
  else
  {
    exit = exit | BOOST_BINARY(1);
    std::cout << "Test Kalman filter FAILED: estimationError = " << error << std::endl;
  }
  if((error = testKalmanFilterZeroInput()) < 0.1)
  {
    std::cout << "Test Kalman filter (zero input) SUCCEEDED: estimationError = " << error << std::endl;
  }
  else
  {
    exit = exit | BOOST_BINARY(10);
    std::cout << "Test Kalman filter (zero input) FAILED: estimationError = " << error << std::endl;
  }
  if((error = testExtendedKalmanFilter()) < 0.1)
  {
    std::cout << "Test extended Kalman filter SUCCEEDED: estimationError = " << error << std::endl;
  }
  else
  {
    exit = exit | BOOST_BINARY(100);
    std::cout << "Test extended Kalman filter FAILED: estimationError = " << error << std::endl;
  }
  if((error = testExtendedKalmanFilterLTV()) < 0.1)
  {
    std::cout << "Test extended Kalman filter (LTV) SUCCEEDED: estimationError = " << error << std::endl;
  }
  else
  {
    exit = exit | BOOST_BINARY(1000);
    std::cout << "Test extended Kalman filter (LTV) FAILED: estimationError = " << error << std::endl;
  }
  if((error = testExtendedKalmanFilterZeroInput()) < 0.1)
  {
    std::cout << "Test extended Kalman filter (zero input) SUCCEEDED: estimationError = " << error << std::endl;
  }
  else
  {
    exit = exit | BOOST_BINARY(10000);
    std::cout << "Test extended Kalman filter (zero input) FAILED: estimationError = " << error << std::endl
              << std::endl;
  }

  std::cout << "Test exit code " << std::bitset<16>(exit) << std::endl;

  return exit;
}